

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linux-perf-events.h
# Opt level: O0

void __thiscall LinuxEvents<0>::report_error(LinuxEvents<0> *this,string *context)

{
  int *piVar1;
  ostream *this_00;
  long in_RDI;
  char *in_stack_ffffffffffffff80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffa0;
  string local_50 [32];
  string local_30 [48];
  
  if ((*(byte *)(in_RDI + 4) & 1) != 0) {
    std::operator+(in_stack_ffffffffffffff88,in_stack_ffffffffffffff80);
    piVar1 = __errno_location();
    strerror(*piVar1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffffa0,(char *)in_stack_ffffffffffffff98,
               (allocator<char> *)in_stack_ffffffffffffff90);
    std::operator+(in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
    this_00 = std::operator<<((ostream *)&std::cerr,local_30);
    std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string(local_30);
    std::__cxx11::string::~string((string *)&stack0xffffffffffffff90);
    std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff8f);
    std::__cxx11::string::~string(local_50);
  }
  *(undefined1 *)(in_RDI + 4) = 0;
  return;
}

Assistant:

void report_error(const std::string &context) {
     if(working) std::cerr << (context + ": " + std::string(strerror(errno))) << std::endl;
     working = false;
  }